

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.hh
# Opt level: O0

void __thiscall
kratos::TaskStmtBlock::TaskStmtBlock(TaskStmtBlock *this,Generator *parent,string *function_name)

{
  string local_40;
  string *local_20;
  string *function_name_local;
  Generator *parent_local;
  TaskStmtBlock *this_local;
  
  local_20 = function_name;
  function_name_local = (string *)parent;
  parent_local = (Generator *)this;
  std::__cxx11::string::string((string *)&local_40,(string *)function_name);
  FunctionStmtBlock::FunctionStmtBlock(&this->super_FunctionStmtBlock,parent,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  (this->super_FunctionStmtBlock).super_StmtBlock.super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_00591750;
  return;
}

Assistant:

TaskStmtBlock(Generator *parent, std::string function_name)
        : FunctionStmtBlock(parent, std::move(function_name)) {}